

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersector1<4,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::ObjectIntersector1<false>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  Geometry *this;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 (*pauVar12) [16];
  bool bVar13;
  bool bVar14;
  uint uVar15;
  undefined1 (*pauVar16) [16];
  ulong uVar17;
  ulong uVar18;
  size_t i;
  long lVar19;
  byte bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1048 [8];
  float fStack_1040;
  float fStack_103c;
  long local_1030;
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  undefined1 local_ff8 [16];
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    return false;
  }
  uStack_f70 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar30 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar2 = (context->query_radius).field_0;
    auVar21 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    auVar30 = ZEXT1664(auVar21);
  }
  pauVar16 = (undefined1 (*) [16])local_f68;
  uVar1 = *(undefined4 *)&(query->p).field_0;
  local_f98._4_4_ = uVar1;
  local_f98._0_4_ = uVar1;
  local_f98._8_4_ = uVar1;
  local_f98._12_4_ = uVar1;
  auVar28 = ZEXT1664(local_f98);
  uVar1 = *(undefined4 *)((long)&(query->p).field_0 + 4);
  local_fa8._4_4_ = uVar1;
  local_fa8._0_4_ = uVar1;
  local_fa8._8_4_ = uVar1;
  local_fa8._12_4_ = uVar1;
  auVar29 = ZEXT1664(local_fa8);
  uVar1 = *(undefined4 *)((long)&(query->p).field_0 + 8);
  local_fb8._4_4_ = uVar1;
  local_fb8._0_4_ = uVar1;
  local_fb8._8_4_ = uVar1;
  local_fb8._12_4_ = uVar1;
  auVar31 = ZEXT1664(local_fb8);
  uVar1 = *(undefined4 *)&(context->query_radius).field_0;
  auVar21._4_4_ = uVar1;
  auVar21._0_4_ = uVar1;
  auVar21._8_4_ = uVar1;
  auVar21._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar23._4_4_ = uVar1;
  auVar23._0_4_ = uVar1;
  auVar23._8_4_ = uVar1;
  auVar23._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar25._4_4_ = uVar1;
  auVar25._0_4_ = uVar1;
  auVar25._8_4_ = uVar1;
  auVar25._12_4_ = uVar1;
  bVar14 = false;
  do {
    local_fd8 = vsubps_avx(auVar28._0_16_,auVar21);
    fVar6 = auVar21._0_4_;
    fVar7 = auVar21._4_4_;
    fVar8 = auVar21._8_4_;
    fVar9 = auVar21._12_4_;
    local_fe8 = auVar28._0_4_ + fVar6;
    fStack_fe4 = auVar28._4_4_ + fVar7;
    fStack_fe0 = auVar28._8_4_ + fVar8;
    fStack_fdc = auVar28._12_4_ + fVar9;
    local_ff8 = vsubps_avx(auVar29._0_16_,auVar23);
    local_1008 = auVar29._0_4_ + auVar23._0_4_;
    fStack_1004 = auVar29._4_4_ + auVar23._4_4_;
    fStack_1000 = auVar29._8_4_ + auVar23._8_4_;
    fStack_ffc = auVar29._12_4_ + auVar23._12_4_;
    local_1018 = vsubps_avx(auVar31._0_16_,auVar25);
    local_1028._0_4_ = auVar31._0_4_ + auVar25._0_4_;
    local_1028._4_4_ = auVar31._4_4_ + auVar25._4_4_;
    local_1028._8_4_ = auVar31._8_4_ + auVar25._8_4_;
    local_1028._12_4_ = auVar31._12_4_ + auVar25._12_4_;
    local_f88._0_4_ = fVar6 * fVar6;
    local_f88._4_4_ = fVar7 * fVar7;
    local_f88._8_4_ = fVar8 * fVar8;
    local_f88._12_4_ = fVar9 * fVar9;
    auVar32 = ZEXT1664(local_f88);
    local_fc8 = auVar30._0_16_;
LAB_00b83b39:
    do {
      do {
        if (pauVar16 == (undefined1 (*) [16])&local_f78) {
          return bVar14;
        }
        pauVar12 = pauVar16 + -1;
        pauVar16 = pauVar16 + -1;
      } while (auVar30._0_4_ < *(float *)(*pauVar12 + 8));
      uVar17 = *(ulong *)*pauVar16;
LAB_00b83b58:
      auVar21 = auVar28._0_16_;
      auVar23 = auVar29._0_16_;
      auVar25 = auVar31._0_16_;
      if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
        if ((uVar17 & 8) != 0) goto LAB_00b83e5b;
        auVar10 = *(undefined1 (*) [16])(uVar17 + 0x20);
        auVar22 = *(undefined1 (*) [16])(uVar17 + 0x30);
        auVar11 = vmaxps_avx(auVar21,auVar10);
        auVar11 = vminps_avx(auVar11,auVar22);
        auVar11 = vsubps_avx(auVar11,auVar21);
        auVar21 = vmaxps_avx(auVar23,*(undefined1 (*) [16])(uVar17 + 0x40));
        auVar21 = vminps_avx(auVar21,*(undefined1 (*) [16])(uVar17 + 0x50));
        auVar23 = vsubps_avx(auVar21,auVar23);
        auVar21 = vmaxps_avx(auVar25,*(undefined1 (*) [16])(uVar17 + 0x60));
        auVar21 = vminps_avx(auVar21,*(undefined1 (*) [16])(uVar17 + 0x70));
        auVar21 = vsubps_avx(auVar21,auVar25);
        local_1048._4_4_ =
             auVar11._4_4_ * auVar11._4_4_ + auVar23._4_4_ * auVar23._4_4_ +
             auVar21._4_4_ * auVar21._4_4_;
        local_1048._0_4_ =
             auVar11._0_4_ * auVar11._0_4_ + auVar23._0_4_ * auVar23._0_4_ +
             auVar21._0_4_ * auVar21._0_4_;
        fStack_1040 = auVar11._8_4_ * auVar11._8_4_ + auVar23._8_4_ * auVar23._8_4_ +
                      auVar21._8_4_ * auVar21._8_4_;
        fStack_103c = auVar11._12_4_ * auVar11._12_4_ + auVar23._12_4_ * auVar23._12_4_ +
                      auVar21._12_4_ * auVar21._12_4_;
        auVar21 = vcmpps_avx(auVar10,auVar22,2);
        auVar23 = vcmpps_avx(*(undefined1 (*) [16])(uVar17 + 0x50),local_ff8,5);
        auVar21 = vandps_avx(auVar21,auVar23);
        auVar11._4_4_ = fStack_fe4;
        auVar11._0_4_ = local_fe8;
        auVar11._8_4_ = fStack_fe0;
        auVar11._12_4_ = fStack_fdc;
        auVar23 = vcmpps_avx(auVar10,auVar11,2);
        auVar10._4_4_ = fStack_1004;
        auVar10._0_4_ = local_1008;
        auVar10._8_4_ = fStack_1000;
        auVar10._12_4_ = fStack_ffc;
        auVar25 = vcmpps_avx(*(undefined1 (*) [16])(uVar17 + 0x40),auVar10,2);
        auVar23 = vandps_avx(auVar25,auVar23);
        auVar25 = vcmpps_avx(*(undefined1 (*) [16])(uVar17 + 0x70),local_1018,5);
        auVar21 = vandps_avx(auVar21,auVar25);
        auVar25 = vcmpps_avx(auVar22,local_fd8,5);
        auVar10 = vcmpps_avx(*(undefined1 (*) [16])(uVar17 + 0x60),local_1028,2);
        auVar25 = vandps_avx(auVar10,auVar25);
        auVar23 = vandps_avx(auVar23,auVar25);
        auVar21 = vandps_avx(auVar23,auVar21);
LAB_00b83bd0:
        auVar21 = vpslld_avx(auVar21,0x1f);
        uVar15 = vmovmskps_avx(auVar21);
        if (uVar15 != 0) {
          uVar15 = uVar15 & 0xff;
          uVar18 = uVar17 & 0xfffffffffffffff0;
          lVar19 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
            }
          }
          uVar17 = *(ulong *)(uVar18 + lVar19 * 8);
          uVar15 = uVar15 - 1 & uVar15;
          if (uVar15 != 0) {
            uVar3 = *(uint *)(local_1048 + lVar19 * 4);
            lVar19 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
              }
            }
            uVar5 = *(ulong *)(uVar18 + lVar19 * 8);
            uVar4 = *(uint *)(local_1048 + lVar19 * 4);
            uVar15 = uVar15 - 1 & uVar15;
            if (uVar15 == 0) {
              if (uVar3 < uVar4) {
                *(ulong *)*pauVar16 = uVar5;
                *(uint *)(*pauVar16 + 8) = uVar4;
                pauVar16 = pauVar16 + 1;
              }
              else {
                *(ulong *)*pauVar16 = uVar17;
                *(uint *)(*pauVar16 + 8) = uVar3;
                pauVar16 = pauVar16 + 1;
                uVar17 = uVar5;
              }
            }
            else {
              auVar22._8_8_ = 0;
              auVar22._0_8_ = uVar17;
              auVar21 = vpunpcklqdq_avx(auVar22,ZEXT416(uVar3));
              auVar24._8_8_ = 0;
              auVar24._0_8_ = uVar5;
              auVar23 = vpunpcklqdq_avx(auVar24,ZEXT416(uVar4));
              lVar19 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                }
              }
              auVar26._8_8_ = 0;
              auVar26._0_8_ = *(ulong *)(uVar18 + lVar19 * 8);
              auVar10 = vpunpcklqdq_avx(auVar26,ZEXT416(*(uint *)(local_1048 + lVar19 * 4)));
              auVar25 = vpcmpgtd_avx(auVar23,auVar21);
              uVar15 = uVar15 - 1 & uVar15;
              if (uVar15 == 0) {
                auVar22 = vpshufd_avx(auVar25,0xaa);
                auVar25 = vblendvps_avx(auVar23,auVar21,auVar22);
                auVar21 = vblendvps_avx(auVar21,auVar23,auVar22);
                auVar23 = vpcmpgtd_avx(auVar10,auVar25);
                auVar22 = vpshufd_avx(auVar23,0xaa);
                auVar23 = vblendvps_avx(auVar10,auVar25,auVar22);
                auVar25 = vblendvps_avx(auVar25,auVar10,auVar22);
                auVar10 = vpcmpgtd_avx(auVar25,auVar21);
                auVar22 = vpshufd_avx(auVar10,0xaa);
                auVar10 = vblendvps_avx(auVar25,auVar21,auVar22);
                auVar21 = vblendvps_avx(auVar21,auVar25,auVar22);
                *pauVar16 = auVar21;
                pauVar16[1] = auVar10;
                uVar17 = auVar23._0_8_;
                pauVar16 = pauVar16 + 2;
              }
              else {
                lVar19 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                  }
                }
                auVar27._8_8_ = 0;
                auVar27._0_8_ = *(ulong *)(uVar18 + lVar19 * 8);
                auVar11 = vpunpcklqdq_avx(auVar27,ZEXT416(*(uint *)(local_1048 + lVar19 * 4)));
                auVar22 = vpshufd_avx(auVar25,0xaa);
                auVar25 = vblendvps_avx(auVar23,auVar21,auVar22);
                auVar21 = vblendvps_avx(auVar21,auVar23,auVar22);
                auVar23 = vpcmpgtd_avx(auVar11,auVar10);
                auVar22 = vpshufd_avx(auVar23,0xaa);
                auVar23 = vblendvps_avx(auVar11,auVar10,auVar22);
                auVar10 = vblendvps_avx(auVar10,auVar11,auVar22);
                auVar22 = vpcmpgtd_avx(auVar10,auVar21);
                auVar11 = vpshufd_avx(auVar22,0xaa);
                auVar22 = vblendvps_avx(auVar10,auVar21,auVar11);
                auVar21 = vblendvps_avx(auVar21,auVar10,auVar11);
                auVar10 = vpcmpgtd_avx(auVar23,auVar25);
                auVar11 = vpshufd_avx(auVar10,0xaa);
                auVar10 = vblendvps_avx(auVar23,auVar25,auVar11);
                auVar23 = vblendvps_avx(auVar25,auVar23,auVar11);
                auVar25 = vpcmpgtd_avx(auVar22,auVar23);
                auVar11 = vpshufd_avx(auVar25,0xaa);
                auVar25 = vblendvps_avx(auVar22,auVar23,auVar11);
                auVar23 = vblendvps_avx(auVar23,auVar22,auVar11);
                *pauVar16 = auVar21;
                pauVar16[1] = auVar23;
                pauVar16[2] = auVar25;
                uVar17 = auVar10._0_8_;
                pauVar16 = pauVar16 + 3;
              }
            }
          }
          goto LAB_00b83b58;
        }
        goto LAB_00b83b39;
      }
      if ((uVar17 & 8) == 0) {
        auVar10 = vmaxps_avx(auVar21,*(undefined1 (*) [16])(uVar17 + 0x20));
        auVar22 = vminps_avx(auVar10,*(undefined1 (*) [16])(uVar17 + 0x30));
        auVar10 = vmaxps_avx(auVar23,*(undefined1 (*) [16])(uVar17 + 0x40));
        auVar10 = vminps_avx(auVar10,*(undefined1 (*) [16])(uVar17 + 0x50));
        auVar22 = vsubps_avx(auVar22,auVar21);
        auVar23 = vsubps_avx(auVar10,auVar23);
        auVar21 = vmaxps_avx(auVar25,*(undefined1 (*) [16])(uVar17 + 0x60));
        auVar21 = vminps_avx(auVar21,*(undefined1 (*) [16])(uVar17 + 0x70));
        auVar21 = vsubps_avx(auVar21,auVar25);
        local_1048._0_4_ =
             auVar22._0_4_ * auVar22._0_4_ + auVar23._0_4_ * auVar23._0_4_ +
             auVar21._0_4_ * auVar21._0_4_;
        local_1048._4_4_ =
             auVar22._4_4_ * auVar22._4_4_ + auVar23._4_4_ * auVar23._4_4_ +
             auVar21._4_4_ * auVar21._4_4_;
        fStack_1040 = auVar22._8_4_ * auVar22._8_4_ + auVar23._8_4_ * auVar23._8_4_ +
                      auVar21._8_4_ * auVar21._8_4_;
        fStack_103c = auVar22._12_4_ * auVar22._12_4_ + auVar23._12_4_ * auVar23._12_4_ +
                      auVar21._12_4_ * auVar21._12_4_;
        auVar21 = vcmpps_avx(_local_1048,auVar32._0_16_,2);
        auVar23 = vcmpps_avx(*(undefined1 (*) [16])(uVar17 + 0x20),
                             *(undefined1 (*) [16])(uVar17 + 0x30),2);
        auVar21 = vandps_avx(auVar21,auVar23);
        goto LAB_00b83bd0;
      }
LAB_00b83e5b:
      local_1030 = (ulong)((uint)uVar17 & 0xf) - 8;
      bVar20 = 0;
      for (lVar19 = 0; local_1030 != lVar19; lVar19 = lVar19 + 1) {
        uVar15 = *(uint *)((uVar17 & 0xfffffffffffffff0) + lVar19 * 8);
        this = (context->scene->geometries).items[uVar15].ptr;
        context->geomID = uVar15;
        context->primID = *(uint *)((uVar17 & 0xfffffffffffffff0) + 4 + lVar19 * 8);
        bVar13 = Geometry::pointQuery(this,query,context);
        auVar32 = ZEXT1664(local_f88);
        auVar31 = ZEXT1664(local_fb8);
        auVar29 = ZEXT1664(local_fa8);
        auVar28 = ZEXT1664(local_f98);
        bVar20 = bVar20 | bVar13;
      }
      auVar30 = ZEXT1664(local_fc8);
    } while (bVar20 == 0);
    uVar1 = *(undefined4 *)&(context->query_radius).field_0;
    auVar21._4_4_ = uVar1;
    auVar21._0_4_ = uVar1;
    auVar21._8_4_ = uVar1;
    auVar21._12_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar23._4_4_ = uVar1;
    auVar23._0_4_ = uVar1;
    auVar23._8_4_ = uVar1;
    auVar23._12_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar25._4_4_ = uVar1;
    auVar25._0_4_ = uVar1;
    auVar25._8_4_ = uVar1;
    auVar25._12_4_ = uVar1;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar30 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar2 = (context->query_radius).field_0;
      auVar10 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
      auVar30 = ZEXT1664(auVar10);
    }
    bVar14 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }